

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

bool __thiscall sjtu::trainType::getrecord(trainType *this,recordType *record,bool flag)

{
  timeType *other;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  byte bVar5;
  undefined7 in_register_00000011;
  long lVar6;
  char *__lhs;
  long lVar7;
  int unaff_R13D;
  timeType local_b8;
  ulong local_a0;
  undefined4 local_98;
  undefined4 local_94;
  timeType *local_90;
  timeType *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  timeType local_70;
  timeType *local_60;
  long local_58;
  string local_50;
  
  local_98 = (undefined4)CONCAT71(in_register_00000011,flag);
  if (this->is_released == true) {
    local_b8.month = this->saleDate[0].month;
    local_b8.day = this->saleDate[0].day;
    local_b8.hour = (this->startTime).hour;
    local_b8.minute = (this->startTime).minute;
    local_88 = this->saleDate;
    local_80 = record->station + 1;
    local_78 = record->station;
    local_90 = record->time;
    local_60 = this->saleDate + 1;
    lVar7 = 0;
    local_a0 = 0;
    for (lVar6 = 0; lVar6 < this->stationNum; lVar6 = lVar6 + 1) {
      if (lVar7 != 0) {
        timeType::operator+(&local_70,&local_b8.month);
        local_b8.month = local_70.month;
        local_b8.day = local_70.day;
        local_b8.hour = local_70.hour;
        local_b8.minute = local_70.minute;
      }
      __lhs = this->stations[0].stationName + lVar7;
      if ((local_a0 & 1) == 0) {
        bVar1 = std::operator==(__lhs,local_80);
        if (bVar1) {
          bVar2 = 0;
          bVar5 = 0;
          goto LAB_0010a220;
        }
      }
      else {
        iVar3 = *(int *)((long)this->stations[0].seatNum + (long)unaff_R13D * 4 + lVar7);
        if (record->seat < iVar3) {
          iVar3 = record->seat;
        }
        record->seat = iVar3;
        record->price = record->price + *(int *)((long)&this->stations[0].price + lVar7);
        record->duration = record->duration + *(int *)((long)&this->stations[0].travelTime + lVar7);
        bVar1 = std::operator==(__lhs,local_80);
        if (bVar1) {
          record->time[1].month = local_b8.month;
          record->time[1].day = local_b8.day;
          record->time[1].hour = local_b8.hour;
          record->time[1].minute = local_b8.minute;
          bVar2 = 1;
          bVar5 = 1;
          goto LAB_0010a220;
        }
        record->duration =
             record->duration + *(int *)((long)&this->stations[0].stopoverTime + lVar7);
      }
      if (lVar7 != 0) {
        timeType::operator+(&local_70,&local_b8.month);
        local_b8.month = local_70.month;
        local_b8.day = local_70.day;
        local_b8.hour = local_70.hour;
        local_b8.minute = local_70.minute;
      }
      bVar1 = std::operator==(__lhs,local_78);
      other = local_90;
      if (bVar1) {
        record->price = 0;
        record->seat = 100000;
        record->duration = 0;
        local_58 = lVar6;
        if ((char)local_98 == '\0') {
          local_b8.month = local_90->month;
          local_b8.day = local_90->day;
        }
        else {
          bVar1 = timeType::operator<(&local_b8,local_90);
          if (bVar1) {
            local_b8.month = other->month;
            local_b8.day = other->day;
          }
          bVar1 = timeType::operator<(&local_b8,other);
          if (bVar1) {
            local_94 = 0x5a0;
            timeType::operator+(&local_70,&local_b8.month);
            local_b8.month = local_70.month;
            local_b8.day = local_70.day;
            local_b8.hour = local_70.hour;
            local_b8.minute = local_70.minute;
          }
        }
        iVar3 = timeType::dateminus(&local_b8,local_88);
        std::__cxx11::string::string((string *)&local_50,(string *)local_78);
        iVar4 = get_Delta_date(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        unaff_R13D = iVar4 + iVar3;
        if (unaff_R13D < 0) break;
        iVar3 = timeType::dateminus(local_60,local_88);
        if (iVar3 < unaff_R13D) break;
        local_90->month = local_b8.month;
        local_90->day = local_b8.day;
        local_90->hour = local_b8.hour;
        local_90->minute = local_b8.minute;
        local_a0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        lVar6 = local_58;
      }
      lVar7 = lVar7 + 0x1a8;
    }
    bVar5 = 0;
    bVar2 = (byte)local_a0;
LAB_0010a220:
    bVar1 = (bool)(bVar2 & bVar5);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool getrecord(recordType *record , bool flag = false)
		{
			if (!is_released) return false;
			timeType actual_time(startTime);
			actual_time.month = saleDate[0].month , actual_time.day = saleDate[0].day;
			bool found = false , end_flag = false;
			for (int i = 0 , day_id;i < stationNum;++ i)
			{
				if (i) actual_time = actual_time + stations[i].travelTime;
				if (found)
				{
					record -> seat = record -> seat < stations[i].seatNum[day_id] ? record -> seat : stations[i].seatNum[day_id];
					record -> price += stations[i].price , record -> duration += stations[i].travelTime;
					if (stations[i].stationName == record -> station[1])
					{
						record -> time[1] = actual_time , end_flag = true;
						break;
					}
					record -> duration += stations[i].stopoverTime;
				}
				else if (stations[i].stationName == record -> station[1]) break;
				if (i) actual_time = actual_time + stations[i].stopoverTime;
				if (stations[i].stationName == record -> station[0])
				{
					record -> price = 0 , record -> duration = 0 , record -> seat = 100000;
					if (!flag || actual_time < record -> time[0]) actual_time.month = record -> time[0].month , actual_time.day = record -> time[0].day;
					if (flag && actual_time < record -> time[0]) actual_time = actual_time + 24 * 60;
					day_id = timeType::dateminus(actual_time , saleDate[0]) + get_Delta_date(record -> station[0]);
					if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) break;
					record -> time[0] = actual_time;
					found = true;
				}
			}
			if (!found || !end_flag) return false;
			return true;
		}